

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,int64_t n,DisplayUnit unit)

{
  char *pcVar1;
  char local_27 [15];
  
  pcVar1 = Format64(local_27,0,n);
  if (*pcVar1 != '0' || pcVar1 + 1 != local_27) {
    std::__cxx11::string::append((char *)out,(ulong)pcVar1);
    std::__cxx11::string::append((char *)out,(ulong)unit.abbr._M_str);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, static_cast<size_t>(ep - bp));
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}